

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O0

void push64(lua_State *L,uint64_t r)

{
  char local_20;
  undefined1 local_1f;
  undefined1 local_1e;
  undefined1 local_1d;
  undefined1 local_1c;
  undefined1 local_1b;
  undefined1 local_1a;
  undefined1 local_19;
  uint8_t tmp [8];
  uint64_t r_local;
  lua_State *L_local;
  
  local_20 = (char)r;
  local_1f = (undefined1)(r >> 8);
  local_1e = (undefined1)(r >> 0x10);
  local_1d = (undefined1)(r >> 0x18);
  local_1c = (undefined1)(r >> 0x20);
  local_1b = (undefined1)(r >> 0x28);
  local_1a = (undefined1)(r >> 0x30);
  local_19 = (undefined1)(r >> 0x38);
  tmp = (uint8_t  [8])r;
  lua_pushlstring(L,&local_20,8);
  return;
}

Assistant:

static void
push64(lua_State *L, uint64_t r) {
	uint8_t tmp[8];
	tmp[0] = r & 0xff;
	tmp[1] = (r >> 8 )& 0xff;
	tmp[2] = (r >> 16 )& 0xff;
	tmp[3] = (r >> 24 )& 0xff;
	tmp[4] = (r >> 32 )& 0xff;
	tmp[5] = (r >> 40 )& 0xff;
	tmp[6] = (r >> 48 )& 0xff;
	tmp[7] = (r >> 56 )& 0xff;

	lua_pushlstring(L, (const char *)tmp, 8);
}